

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManChoiceLevel(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int local_1c;
  int LevelMax;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  iVar1 = Gia_ManObjNum(p);
  Gia_ManCleanLevels(p,iVar1);
  Gia_ManIncrementTravId(p);
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar2 = false;
    if (local_1c < iVar1) {
      _LevelMax = Gia_ManCo(p,local_1c);
      bVar2 = _LevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Gia_ManChoiceLevel_rec(p,_LevelMax);
    iVar1 = Gia_ObjLevel(p,_LevelMax);
    if (local_20 < iVar1) {
      local_20 = Gia_ObjLevel(p,_LevelMax);
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar2 = false;
    if (local_1c < iVar1) {
      _LevelMax = Gia_ManCi(p,local_1c);
      bVar2 = _LevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Gia_ManChoiceLevel_rec(p,_LevelMax);
    iVar1 = Gia_ObjLevel(p,_LevelMax);
    if (local_20 < iVar1) {
      local_20 = Gia_ObjLevel(p,_LevelMax);
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->nObjs) {
      _LevelMax = Gia_ManObj(p,local_1c);
      bVar2 = _LevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(_LevelMax);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjLevel(p,_LevelMax), iVar1 < 1)) {
      __assert_fail("Gia_ObjLevel(p, pObj) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x2f9,"int Gia_ManChoiceLevel(Gia_Man_t *)");
    }
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManChoiceLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
//    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
    }
    // account for dangling boxes
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
//        Abc_Print( 1, "%d ", Gia_ObjLevel(p, pObj) );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjLevel(p, pObj) > 0 );
//    printf( "Max level %d\n", LevelMax );
    return LevelMax;
}